

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O2

ans_int_encode *
ans_int_encode::create(ans_int_encode *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  uint32_t uVar1;
  uint uVar2;
  pointer peVar3;
  size_t i;
  size_t sVar4;
  pointer puVar5;
  size_t i_1;
  int iVar6;
  long lVar7;
  uint32_t uVar8;
  uint largest_sym;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  largest_sym = 0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
    if (largest_sym < in_u32[sVar4]) {
      largest_sym = in_u32[sVar4];
    }
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&freqs,(ulong)(largest_sym + 1),(value_type_conflict2 *)&local_48,&local_61);
  for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
    freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[in_u32[sVar4]] =
         freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[in_u32[sVar4]] + 1;
  }
  iVar6 = 0;
  adjust_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&freqs,largest_sym,
               false,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  for (puVar5 = (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 != (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    iVar6 = iVar6 + *puVar5;
  }
  __return_storage_ptr__->frame_size = (long)iVar6;
  std::vector<enc_entry_int,_std::allocator<enc_entry_int>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar5 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  peVar3 = (__return_storage_ptr__->table).
           super__Vector_base<enc_entry_int,_std::allocator<enc_entry_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  for (lVar7 = 0; (ulong)largest_sym * 4 + 4 != lVar7; lVar7 = lVar7 + 4) {
    uVar1 = *(uint32_t *)((long)puVar5 + lVar7);
    if (uVar1 != 0) {
      (&peVar3->freq)[lVar7] = uVar1;
      (&peVar3->base)[lVar7] = uVar8;
      uVar2 = *(uint *)((long)puVar5 + lVar7);
      uVar8 = uVar8 + uVar2;
      *(ulong *)((long)&peVar3->sym_upper_bound + lVar7 * 4) = (ulong)uVar2 << 0x24;
    }
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

static ans_int_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_int_encode model;
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            max_sym = std::max(in_u32[i], max_sym);
        }
        std::vector<uint64_t> freqs(max_sym + 1, 0);
        for (size_t i = 0; i < n; i++) {
            freqs[in_u32[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, false);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;

        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym <= max_sym; sym++) {
            if (model.nfreqs[sym] == 0)
                continue;
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }